

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O3

DLS_Data * Timidity::LoadDLS(FILE *src)

{
  uint uVar1;
  DLS_Wave *pDVar2;
  ULONG UVar3;
  uint uVar4;
  WSMPL *pWVar5;
  uint uVar6;
  DWORD DVar7;
  uint uVar8;
  RGNHEADER *header;
  DLS_Data *data;
  RIFF_Chunk *pRVar9;
  DLS_Region *pDVar10;
  POOLTABLE PVar11;
  DLS_Instrument *pDVar12;
  DLS_Wave *__ptr;
  RIFF_Chunk *pRVar13;
  int iVar14;
  POOLTABLE PVar15;
  POOLTABLE connList_ptr;
  RIFF_Chunk *pRVar16;
  char **ppcVar17;
  POOLTABLE PVar18;
  POOLTABLE data_00;
  ulong uVar19;
  DLS_Data *data_01;
  POOLTABLE *local_70;
  
  data = (DLS_Data *)calloc(1,0x50);
  if (data != (DLS_Data *)0x0) {
    pRVar9 = LoadRIFF(src);
    data->chunk = pRVar9;
    if (pRVar9 != (RIFF_Chunk *)0x0) {
      pRVar9 = pRVar9->child;
      if (pRVar9 == (RIFF_Chunk *)0x0) {
        return data;
      }
      __ptr = (DLS_Wave *)0x0;
      local_70 = (POOLTABLE *)0x0;
      do {
        DVar7 = pRVar9->magic;
        if (DVar7 == 0x5453494c) {
          DVar7 = pRVar9->subtype;
        }
        if ((int)DVar7 < 0x6c627470) {
          if (DVar7 == 0x4f464e49) {
            for (pRVar13 = pRVar9->child; pRVar13 != (RIFF_Chunk *)0x0; pRVar13 = pRVar13->next) {
              DVar7 = pRVar13->magic;
              if (DVar7 == 0x5453494c) {
                DVar7 = pRVar13->subtype;
              }
              if ((int)DVar7 < 0x544d4349) {
                ppcVar17 = &data->name;
                if ((DVar7 == 0x4d414e49) || (ppcVar17 = &data->copyright, DVar7 == 0x504f4349)) {
LAB_00327731:
                  *ppcVar17 = (char *)pRVar13->data;
                }
              }
              else {
                ppcVar17 = &data->artist;
                if ((DVar7 == 0x54524149) || (ppcVar17 = &data->comments, DVar7 == 0x544d4349))
                goto LAB_00327731;
              }
            }
          }
          else if (DVar7 == 0x686c6f63) {
            DVar7 = *(DWORD *)pRVar9->data;
            data->cInstruments = DVar7;
            FreeInstruments(data);
            pDVar12 = (DLS_Instrument *)calloc(1,(long)(int)(DVar7 * 0x28));
            data->instruments = pDVar12;
          }
        }
        else if (DVar7 == 0x6c627470) {
          local_70 = (POOLTABLE *)pRVar9->data;
          data->ptbl = local_70;
          data->ptblList = (POOLCUE *)((long)&local_70->cbSize + (ulong)local_70->cbSize);
          UVar3 = local_70->cCues;
          if (__ptr != (DLS_Wave *)0x0) {
            free(__ptr);
          }
          __ptr = (DLS_Wave *)calloc(1,(long)(int)(UVar3 * 0x28));
          data->waveList = __ptr;
        }
        else if (DVar7 == 0x6c707677) {
          pRVar13 = pRVar9->child;
          if (pRVar13 != (RIFF_Chunk *)0x0) {
            uVar19 = 0;
            do {
              DVar7 = pRVar13->magic;
              if (DVar7 == 0x5453494c) {
                DVar7 = pRVar13->subtype;
              }
              if ((DVar7 == 0x65766177) && ((uint)uVar19 < local_70->cCues)) {
                pRVar16 = pRVar13->child;
                if (pRVar16 != (RIFF_Chunk *)0x0) {
                  pDVar2 = __ptr + uVar19;
                  do {
                    DVar7 = pRVar16->magic;
                    if (DVar7 == 0x5453494c) {
                      DVar7 = pRVar16->subtype;
                    }
                    if (DVar7 == 0x706d7377) {
                      pWVar5 = (WSMPL *)pRVar16->data;
                      uVar8 = pWVar5->cbSize;
                      pDVar2->wsmp = pWVar5;
                      pDVar2->wsmp_loop = (WLOOP *)((long)&pWVar5->cbSize + (ulong)uVar8);
                    }
                    else if (DVar7 == 0x61746164) {
                      DVar7 = pRVar16->length;
                      pDVar2->data = pRVar16->data;
                      pDVar2->length = DVar7;
                    }
                    else if (DVar7 == 0x20746d66) {
                      pDVar2->format = (WaveFMT *)pRVar16->data;
                    }
                    pRVar16 = pRVar16->next;
                  } while (pRVar16 != (RIFF_Chunk *)0x0);
                }
                uVar19 = (ulong)((uint)uVar19 + 1);
              }
              pRVar13 = pRVar13->next;
            } while (pRVar13 != (RIFF_Chunk *)0x0);
          }
        }
        else if ((DVar7 == 0x736e696c) &&
                (PVar15 = (POOLTABLE)pRVar9->child, PVar15 != (POOLTABLE)0x0)) {
          uVar8 = 0;
          do {
            iVar14 = *(int *)PVar15;
            if (iVar14 == 0x5453494c) {
              iVar14 = *(int *)((long)PVar15 + 8);
            }
            uVar6 = uVar8;
            if ((iVar14 == 0x20736e69) && (uVar8 < data->cInstruments)) {
              data_01 = *(DLS_Data **)((long)PVar15 + 0x18);
              uVar6 = uVar8 + 1;
              if (data_01 != (DLS_Data *)0x0) {
                PVar18 = (POOLTABLE)(data->instruments + uVar8);
                connList_ptr = PVar15;
                do {
                  DVar7 = *(DWORD *)&data_01->chunk;
                  if (DVar7 == 0x5453494c) {
                    DVar7 = data_01->cInstruments;
                  }
                  if ((int)DVar7 < 0x68736e69) {
                    if (DVar7 == 0x3272616c) goto LAB_00327447;
                    if (DVar7 == 0x4f464e49) {
                      for (PVar11 = (POOLTABLE)data_01->ptbl; PVar11 != (POOLTABLE)0x0;
                          PVar11 = *(POOLTABLE *)((long)PVar11 + 0x20)) {
                        uVar8 = *(uint *)PVar11;
                        if (uVar8 == 0x5453494c) {
                          uVar8 = ((POOLTABLE *)((long)PVar11 + 8))->cbSize;
                        }
                        connList_ptr.cCues = 0;
                        connList_ptr.cbSize = uVar8;
                        if (uVar8 == 0x4d414e49) {
                          connList_ptr = *(POOLTABLE *)((long)PVar11 + 0x10);
                          *(POOLTABLE *)PVar18 = connList_ptr;
                        }
                      }
                    }
                  }
                  else if (DVar7 == 0x7472616c) {
LAB_00327447:
                    Parse_lart(data_01,(RIFF_Chunk *)((long)PVar18 + 0x18),
                               (CONNECTIONLIST **)((long)PVar18 + 0x20),(CONNECTION **)connList_ptr)
                    ;
                  }
                  else if (DVar7 == 0x6e67726c) {
                    PVar11 = (POOLTABLE)data_01->ptbl;
                    if (PVar11 != (POOLTABLE)0x0) {
                      uVar8 = 0;
                      do {
                        uVar4 = *(uint *)PVar11;
                        if (uVar4 == 0x5453494c) {
                          uVar4 = ((POOLTABLE *)((long)PVar11 + 8))->cbSize;
                        }
                        connList_ptr.cCues = 0;
                        connList_ptr.cbSize = uVar4;
                        uVar1 = uVar8;
                        if (((uVar4 == 0x326e6772) || (uVar4 == 0x206e6772)) &&
                           (connList_ptr = *(POOLTABLE *)((long)PVar18 + 8),
                           uVar8 < *(uint *)connList_ptr)) {
                          uVar1 = uVar8 + 1;
                          connList_ptr.cCues = 0;
                          connList_ptr.cbSize = uVar1;
                          data_00 = *(POOLTABLE *)((long)PVar11 + 0x18);
                          if (data_00 != (POOLTABLE)0x0) {
                            pDVar10 = *(DLS_Region **)((long)PVar18 + 0x10) + uVar8;
                            do {
                              DVar7 = *(DWORD *)data_00;
                              if (DVar7 == 0x5453494c) {
                                DVar7 = *(DWORD *)((long)data_00 + 8);
                              }
                              if ((int)DVar7 < 0x6b6e6c77) {
                                if (DVar7 == 0x3272616c) {
LAB_0032750c:
                                  Parse_lart((DLS_Data *)data_00,(RIFF_Chunk *)&pDVar10->art,
                                             (CONNECTIONLIST **)&pDVar10->artList,
                                             (CONNECTION **)connList_ptr);
                                }
                                else if (DVar7 == 0x686e6772) {
                                  pDVar10->header =
                                       (RGNHEADER *)*(DLS_Instrument **)((long)data_00 + 0x10);
                                }
                              }
                              else if (DVar7 == 0x6b6e6c77) {
                                pDVar10->wlnk =
                                     (WAVELINK *)*(DLS_Instrument **)((long)data_00 + 0x10);
                              }
                              else if (DVar7 == 0x706d7377) {
                                pDVar12 = *(DLS_Instrument **)((long)data_00 + 0x10);
                                connList_ptr = (POOLTABLE)
                                               ((long)&pDVar12->name +
                                               (ulong)*(uint *)&pDVar12->name);
                                pDVar10->wsmp = (WSMPL *)pDVar12;
                                pDVar10->wsmp_loop = (WLOOP *)connList_ptr;
                              }
                              else if (DVar7 == 0x7472616c) goto LAB_0032750c;
                              data_00 = *(POOLTABLE *)((long)data_00 + 0x20);
                            } while (data_00 != (POOLTABLE)0x0);
                          }
                        }
                        uVar8 = uVar1;
                        PVar11 = *(POOLTABLE *)((long)PVar11 + 0x20);
                      } while (PVar11 != (POOLTABLE)0x0);
                    }
                  }
                  else if (DVar7 == 0x68736e69) {
                    pDVar12 = data_01->instruments;
                    *(DLS_Instrument **)((long)PVar18 + 8) = pDVar12;
                    UVar3 = *(ULONG *)&pDVar12->name;
                    connList_ptr = PVar18;
                    if (*(DLS_Region **)((long)PVar18 + 0x10) != (DLS_Region *)0x0) {
                      free(*(DLS_Region **)((long)PVar18 + 0x10));
                    }
                    pDVar10 = (DLS_Region *)calloc(1,(long)(int)(UVar3 * 0x30));
                    *(DLS_Region **)((long)PVar18 + 0x10) = pDVar10;
                  }
                  data_01 = (DLS_Data *)data_01->ptblList;
                } while (data_01 != (DLS_Data *)0x0);
              }
            }
            uVar8 = uVar6;
            PVar15 = *(POOLTABLE *)((long)PVar15 + 0x20);
          } while (PVar15 != (POOLTABLE)0x0);
        }
        pRVar9 = pRVar9->next;
        if (pRVar9 == (RIFF_Chunk *)0x0) {
          return data;
        }
      } while( true );
    }
    FreeDLS(data);
  }
  return (DLS_Data *)0x0;
}

Assistant:

DLS_Data *LoadDLS(FILE *src)
{
	RIFF_Chunk *chunk;
	DLS_Data *data = (DLS_Data *)malloc(sizeof(*data));
	if ( !data ) {
		__Sound_SetError(ERR_OUT_OF_MEMORY);
		return NULL;
	}
	memset(data, 0, sizeof(*data));

	data->chunk = LoadRIFF(src);
	if ( !data->chunk ) {
		FreeDLS(data);
		return NULL;
	}

	for ( chunk = data->chunk->child; chunk; chunk = chunk->next ) {
		DWORD magic = (chunk->magic == FOURCC_LIST) ? chunk->subtype : chunk->magic;
		switch(magic) {
			case FOURCC_COLH:
				Parse_colh(data, chunk);
				break;
			case FOURCC_LINS:
				Parse_lins(data, chunk);
				break;
			case FOURCC_PTBL:
				Parse_ptbl(data, chunk);
				break;
			case FOURCC_WVPL:
				Parse_wvpl(data, chunk);
				break;
			case FOURCC_INFO:
				Parse_INFO_DLS(data, chunk);
				break;
		}
	}
	return data;
}